

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O2

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
BipartiteGraph::vertex_cover
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,BipartiteGraph *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Aindex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Bindex)

{
  double dVar1;
  pointer puVar2;
  pointer puVar3;
  size_type __n;
  unsigned_long uVar4;
  unsigned_long uVar5;
  pointer pvVar6;
  reference pbVar7;
  pointer pVVar8;
  long lVar9;
  pointer pVVar10;
  pointer pdVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  allocator_type local_c9;
  double local_c8;
  long local_c0;
  long local_b8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_b0;
  uint local_a4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AScanList;
  long local_80;
  value_type_conflict1 local_78;
  unsigned_long local_70;
  BipartiteGraph *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> BScanList;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ABflow;
  
  local_b8 = (long)(Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __n = this->nA;
  BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&AScanList,this->nB,
             (value_type_conflict *)&BScanList,(allocator_type *)&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&ABflow,__n,(value_type *)&AScanList,&local_c9);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&AScanList);
  BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&AScanList,this->n,(value_type_conflict1 *)&BScanList,(allocator_type *)&local_78);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(local_b0,4,&AScanList,(allocator_type *)&local_c9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&AScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&AScanList,this->nA,(value_type_conflict1 *)&BScanList,(allocator_type *)&local_78);
  local_78 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&BScanList,this->nB,&local_78,(allocator_type *)&local_c9);
  local_b8 = local_b8 >> 3;
  lVar12 = (long)puVar2 - (long)puVar3 >> 3;
  puVar2 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar8 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar15 = 0.0;
  for (lVar9 = 0; local_b8 != lVar9; lVar9 = lVar9 + 1) {
    dVar15 = dVar15 + pVVar8[puVar2[lVar9]].weight;
  }
  for (lVar9 = 0; local_b8 != lVar9; lVar9 = lVar9 + 1) {
    uVar4 = puVar2[lVar9];
    pVVar8[uVar4].residual = pVVar8[uVar4].weight / dVar15;
  }
  puVar2 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar15 = 0.0;
  for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
    dVar15 = dVar15 + pVVar8[puVar2[lVar9]].weight;
  }
  for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
    pVVar8[puVar2[lVar9]].residual = pVVar8[puVar2[lVar9]].weight / dVar15;
  }
  local_a4 = (uint)CONCAT71((int7)((ulong)puVar2 >> 8),1);
  local_c8 = 1.0;
  local_70 = 0;
  local_68 = this;
LAB_00120ce8:
  if (local_c8 <= 0.0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&AScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&ABflow);
    return local_b0;
  }
  puVar2 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar8 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = 0; local_b8 != lVar9; lVar9 = lVar9 + 1) {
    uVar4 = puVar2[lVar9];
    pVVar8[uVar4].label = -1.0;
    pVVar8[uVar4].pred = -1;
  }
  puVar2 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar10 = pVVar8;
  for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
    uVar4 = puVar2[lVar9];
    pVVar8[uVar4].label = -1.0;
    pVVar8[uVar4].pred = -1;
    pVVar10->label = -1.0;
    pVVar10 = pVVar10 + 1;
  }
  puVar2 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar8 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c0 = 0;
  for (lVar9 = 0; local_b8 != lVar9; lVar9 = lVar9 + 1) {
    uVar4 = puVar2[lVar9];
    dVar15 = pVVar8[uVar4].residual;
    if (dVar15 <= 0.0) {
      dVar15 = -1.0;
    }
    else {
      AScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[local_c0] = uVar4;
      local_c0 = local_c0 + 1;
    }
    pVVar8[uVar4].label = dVar15;
  }
  bVar14 = true;
  local_c8 = 0.0;
  do {
    if ((local_c0 == 0) || (!bVar14)) break;
    local_80 = 0;
    for (lVar9 = 0; lVar9 != local_c0; lVar9 = lVar9 + 1) {
      for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 1) {
        pbVar7 = std::_Deque_iterator<bool,_bool_&,_bool_*>::operator[]
                           ((_Deque_iterator<bool,_bool_&,_bool_*> *)
                            ((long)&(this->edge).
                                    super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [AScanList.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar9]].
                                    super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x10),
                            (Bindex->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar13]);
        if (*pbVar7 == true) {
          uVar4 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar13];
          pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar15 = pVVar8[uVar4].label;
          if ((dVar15 == -1.0) && (!NAN(dVar15))) {
            pVVar8 = pVVar8 + uVar4;
            uVar5 = AScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar9];
            pVVar8->label =
                 (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5].label;
            pVVar8->pred = (int)uVar5;
            BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_80] = uVar4;
            local_80 = local_80 + 1;
          }
        }
      }
    }
    local_c0 = 0;
    for (lVar9 = 0; bVar14 = lVar9 == local_80, !bVar14; lVar9 = lVar9 + 1) {
      uVar4 = BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar15 = pVVar8[uVar4].residual;
      if (0.0 < dVar15) {
        pVVar8 = pVVar8 + uVar4;
        local_c8 = (&pVVar8->label)[(ulong)(dVar15 < pVVar8->label || dVar15 == pVVar8->label) * 2];
        local_a4 = 0;
        local_70 = uVar4;
        break;
      }
      for (lVar13 = 0; local_b8 != lVar13; lVar13 = lVar13 + 1) {
        pbVar7 = std::_Deque_iterator<bool,_bool_&,_bool_*>::operator[]
                           ((_Deque_iterator<bool,_bool_&,_bool_*> *)
                            ((long)&(this->edge).
                                    super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(Aindex->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar13]].
                                    super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x10),
                            BScanList.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar9]);
        if (*pbVar7 == true) {
          uVar4 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar13];
          pVVar8 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar15 = pVVar8[uVar4].label;
          if ((dVar15 == -1.0) && (!NAN(dVar15))) {
            uVar5 = BScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar9];
            dVar15 = ABflow.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5];
            if (0.0 < dVar15) {
              pVVar8 = pVVar8 + uVar4;
              dVar1 = (local_68->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar5].label;
              if (dVar1 <= dVar15) {
                dVar15 = dVar1;
              }
              pVVar8->label = dVar15;
              pVVar8->pred = (int)uVar5;
              AScanList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_c0] = uVar4;
              local_c0 = local_c0 + 1;
            }
          }
        }
        this = local_68;
      }
    }
  } while( true );
  if (local_c8 <= 0.0) {
    puVar2 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar8 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = (local_b0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    for (lVar13 = 0; local_b8 != lVar13; lVar13 = lVar13 + 1) {
      uVar4 = puVar2[lVar13];
      dVar15 = pVVar8[uVar4].label;
      if ((dVar15 == -1.0) && (!NAN(dVar15))) {
        *(unsigned_long *)
         (*(long *)&pvVar6[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + lVar9 * 8) = uVar4;
        lVar9 = lVar9 + 1;
      }
    }
    pvVar6 = (local_b0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    **(long **)&(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data = lVar9;
    puVar2 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 1) {
      uVar4 = puVar2[lVar13];
      if (0.0 <= pVVar8[uVar4].label) {
        *(unsigned_long *)
         (*(long *)&pvVar6[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + lVar9 * 8) = uVar4;
        lVar9 = lVar9 + 1;
      }
    }
    **(long **)&pvVar6[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data = lVar9;
  }
  else if ((local_a4 & 1) == 0) {
    pVVar8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar8[local_70].residual = pVVar8[local_70].residual - local_c8;
    lVar9 = (long)pVVar8[local_70].pred;
    pdVar11 = ABflow.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar9].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar11[local_70] = pdVar11[local_70] + local_c8;
    pVVar10 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_start;
    while( true ) {
      lVar13 = (long)pVVar10[lVar9].pred;
      if (lVar13 == -1) break;
      pdVar11[lVar13] = pdVar11[lVar13] - local_c8;
      lVar9 = (long)pVVar8[lVar13].pred;
      pdVar11 = ABflow.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar9].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar11[lVar13] = pdVar11[lVar13] + local_c8;
    }
    pVVar10[lVar9].residual = pVVar10[lVar9].residual - local_c8;
  }
  goto LAB_00120ce8;
}

Assistant:

vector<vector<size_t>> BipartiteGraph::vertex_cover(const vector<size_t>& Aindex, const vector<size_t>& Bindex) {
    size_t nAVC = Aindex.size(), nBVC = Bindex.size(); //nAVC,nBVC=size of A and B
    double total = 0;
    vector<vector<double>> ABflow(nA, vector<double>(nB, 0.0));
    size_t i=0, j=0, k=0, AScanListSize=0, BScanListSize=0, augmentingPathEnd=0, Apathnode=0, Bpathnode=0;
    bool augmentingPathEndMINUS1 = true;
    vector<vector<size_t>> CD(4, vector<size_t>(this->n, 0)); //output: incidence vectors of vertex covers, CD[0]=Aside; CD[1]=Bside;
    vector<size_t> AScanList(nA, 0);
    vector<size_t> BScanList(nB, 0);

    /* First set normalized weights */
    total = 0;
    for (i = 0; i < nAVC; i++)
        total += this->Avertex[Aindex[i]].weight;
    for (i = 0; i < nAVC; i++)
        this->Avertex[Aindex[i]].residual = this->Avertex[Aindex[i]].weight / total;

    total = 0;
    for (j = 0; j < nBVC; j++)
        total += this->Bvertex[Bindex[j]].weight;
    for (j = 0; j < nBVC; j++)
        this->Bvertex[Bindex[j]].residual = this->Bvertex[Bindex[j]].weight / total;

    /* Now comes the flow algorithm
     * Flow on outside arcs are represented by Vertex[i].residual
     * Flow on inside arcs are represented by ABflow
     * Initialize ABflow to 0, start scanlist
     */

    total = 1; //flow augmentation in last stage
    while (total > 0) {
        //Scan Phase
        //Set labels
        total = 0;
        for (i = 0; i < nAVC; i++) {
            Avertex[Aindex[i]].label = -1;
            Avertex[Aindex[i]].pred = -1;
        }
        for (j = 0; j < nBVC; j++) {
            Bvertex[Bindex[j]].label = -1;
            Bvertex[Bindex[j]].pred = -1;
            Bvertex[j].label = -1;
        }
        AScanListSize = 0;
        for (i = 0; i < nAVC; i++) {
            if (Avertex[Aindex[i]].residual > 0) {
                Avertex[Aindex[i]].label = Avertex[Aindex[i]].residual;
                AScanList[AScanListSize] = Aindex[i];
                AScanListSize++;
            }
            else {
                Avertex[Aindex[i]].label = -1;
            }
        }
//        for (i = 0; i < nBVC; i++) {
//            Bvertex[i].label = -1;
//        }

        // scan for an augmenting path
        bool scanning = true;
        while (AScanListSize != 0 && scanning) {
            /* Scan the A side nodes*/
            BScanListSize = 0;
            for (i = 0; i < AScanListSize; i++) {
                for (j = 0; j < nBVC; j++) {
                    if (edge[AScanList[i]][Bindex[j]] && Bvertex[Bindex[j]].label == -1) {
                        Bvertex[Bindex[j]].label = Avertex[AScanList[i]].label;
                        Bvertex[Bindex[j]].pred = AScanList[i];
                        BScanList[BScanListSize] = Bindex[j];
                        BScanListSize++;
                    }
                }
            }
            /* Scan the B side nodes*/
            AScanListSize = 0;
            for (j = 0; j < BScanListSize; j++) {
                if (Bvertex[BScanList[j]].residual > 0) {
                    total = min(Bvertex[BScanList[j]].residual, Bvertex[BScanList[j]].label);
                    augmentingPathEnd = BScanList[j];
                    augmentingPathEndMINUS1 = false;
                    scanning = false;
                    break;
                } else {
                    for (i = 0; i < nAVC; i++) {
                        if (edge[Aindex[i]][BScanList[j]] && Avertex[Aindex[i]].label == -1 && ABflow[Aindex[i]][BScanList[j]] > 0) {
                            Avertex[Aindex[i]].label = min(Bvertex[BScanList[j]].label, ABflow[Aindex[i]][BScanList[j]]);
                            Avertex[Aindex[i]].pred = BScanList[j];
                            AScanList[AScanListSize] = Aindex[i];
                            AScanListSize++;
                        }
                    }
                }
            }
        }//scanning procedure

        if (total > 0) { // flow augmentation
            if (!augmentingPathEndMINUS1) {
                Bvertex[augmentingPathEnd].residual = Bvertex[augmentingPathEnd].residual - total;
                Bpathnode = augmentingPathEnd;
                Apathnode = Bvertex[Bpathnode].pred;

                ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;
                while (Avertex[Apathnode].pred != -1) {
                    Bpathnode = Avertex[Apathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] - total;
                    Apathnode = Bvertex[Bpathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;

                }
                Avertex[Apathnode].residual = Avertex[Apathnode].residual - total;
            }
        } else { //min vertex cover found, unlabeled A's, labeled B's
            k = 0;
            for (i = 0; i < nAVC; i++)
                if (Avertex[Aindex[i]].label == -1) {
                    CD[2][k] = Aindex[i];
                    k++;
                }
            CD[0][0] = k;
            k = 0;
            for (j = 0; j < nBVC; j++)
                if (Bvertex[Bindex[j]].label >= 0) {
                    CD[3][k] = Bindex[j];
                    k++;
                }
            CD[1][0] = k;
        }
    }//flow algorithm
    return CD;

}